

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManchesterAnalyzerSettings.cpp
# Opt level: O2

void __thiscall
ManchesterAnalyzerSettings::LoadSettings(ManchesterAnalyzerSettings *this,char *settings)

{
  char cVar1;
  int iVar2;
  SimpleArchive text_archive;
  ManchesterTolerance tolerance;
  char *name_string;
  
  SimpleArchive::SimpleArchive(&text_archive);
  SimpleArchive::SetString((char *)&text_archive);
  SimpleArchive::operator>>(&text_archive,&name_string);
  iVar2 = strcmp(name_string,"SaleaeManchesterAnalyzer");
  if (iVar2 != 0) {
    AnalyzerHelpers::Assert
              (
              "SaleaeManchesterAnalyzer: Provided with a settings string that doesn\'t belong to us;"
              );
  }
  SimpleArchive::operator>>(&text_archive,&this->mInputChannel);
  SimpleArchive::operator>>(&text_archive,&this->mMode);
  SimpleArchive::operator>>(&text_archive,&this->mBitRate);
  SimpleArchive::operator>>(&text_archive,&this->mInverted);
  SimpleArchive::operator>>(&text_archive,&this->mBitsPerTransfer);
  SimpleArchive::operator>>(&text_archive,&this->mShiftOrder);
  SimpleArchive::operator>>(&text_archive,&this->mBitsToIgnore);
  cVar1 = SimpleArchive::operator>>(&text_archive,&tolerance);
  if (cVar1 != '\0') {
    this->mTolerance = tolerance;
  }
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mInputChannel,true);
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(&text_archive);
  return;
}

Assistant:

void ManchesterAnalyzerSettings::LoadSettings( const char* settings )
{
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    const char* name_string; // the first thing in the archive is the name of the protocol analyzer that the data belongs to.
    text_archive >> &name_string;
    if( strcmp( name_string, "SaleaeManchesterAnalyzer" ) != 0 )
        AnalyzerHelpers::Assert( "SaleaeManchesterAnalyzer: Provided with a settings string that doesn't belong to us;" );

    text_archive >> mInputChannel;
    text_archive >> *( U32* )&mMode;
    text_archive >> mBitRate;
    text_archive >> mInverted;
    text_archive >> mBitsPerTransfer;
    text_archive >> *( U32* )&mShiftOrder;
    text_archive >> mBitsToIgnore;

    ManchesterTolerance tolerance;
    if( text_archive >> *( U32* )&tolerance )
        mTolerance = tolerance;

    ClearChannels();
    AddChannel( mInputChannel, "Manchester", true );

    UpdateInterfacesFromSettings();
}